

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O2

int nghttp2_stream_update_local_initial_window_size
              (nghttp2_stream *stream,int32_t new_initial_window_size,
              int32_t old_initial_window_size)

{
  int iVar1;
  long lVar2;
  
  lVar2 = ((long)new_initial_window_size - (long)old_initial_window_size) +
          (long)stream->local_window_size;
  iVar1 = (int)lVar2;
  if (iVar1 != lVar2) {
    return -1;
  }
  stream->local_window_size = iVar1;
  return 0;
}

Assistant:

static int update_initial_window_size(int32_t *window_size_ptr,
                                      int32_t new_initial_window_size,
                                      int32_t old_initial_window_size) {
  int64_t new_window_size = (int64_t)(*window_size_ptr) +
                            new_initial_window_size - old_initial_window_size;
  if (INT32_MIN > new_window_size ||
      new_window_size > NGHTTP2_MAX_WINDOW_SIZE) {
    return -1;
  }
  *window_size_ptr = (int32_t)new_window_size;
  return 0;
}